

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

cJSON_bool parse_string(cJSON *item,parse_buffer *input_buffer)

{
  uchar *puVar1;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  cJSON_bool cVar6;
  byte *pbVar7;
  byte bVar8;
  byte bVar9;
  long lVar10;
  byte *pbVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  byte *pbVar15;
  byte *pbVar16;
  long lStack_40;
  
  puVar1 = input_buffer->content;
  pbVar15 = puVar1 + input_buffer->offset + 1;
  if (puVar1[input_buffer->offset] == '\"') {
    lVar10 = 0;
    for (pbVar11 = pbVar15; (ulong)((long)pbVar11 - (long)puVar1) < input_buffer->length;
        pbVar11 = pbVar11 + 1) {
      if (*pbVar11 == 0x5c) {
        pbVar11 = pbVar11 + 1;
        if (input_buffer->length <= (ulong)((long)pbVar11 - (long)puVar1)) break;
        lVar10 = lVar10 + 1;
      }
      else if (*pbVar11 == 0x22) {
        pbVar7 = (byte *)(*(input_buffer->hooks).allocate)
                                   ((size_t)(pbVar11 +
                                            (1 - (long)(puVar1 + lVar10 + input_buffer->offset))));
        pbVar16 = pbVar7;
        if (pbVar7 != (byte *)0x0) goto LAB_00103fb2;
        break;
      }
    }
  }
LAB_0010419b:
  pbVar15 = pbVar15 + -(long)input_buffer->content;
  cVar6 = 0;
  goto LAB_001041a0;
LAB_00103fb2:
  lVar10 = 2;
  if (pbVar15 < pbVar11) {
    bVar8 = *pbVar15;
    if (bVar8 == 0x5c) {
      if ((long)pbVar11 - (long)pbVar15 < 1) {
switchD_0010401d_caseD_6f:
        (*(input_buffer->hooks).deallocate)(pbVar7);
        goto LAB_0010419b;
      }
      bVar8 = pbVar15[1];
      switch(bVar8) {
      case 0x6e:
        *pbVar16 = 10;
        break;
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x73:
        goto switchD_0010401d_caseD_6f;
      case 0x72:
        *pbVar16 = 0xd;
        break;
      case 0x74:
        *pbVar16 = 9;
        break;
      case 0x75:
        if ((ulong)((long)pbVar11 - (long)pbVar15) < 6) goto switchD_0010401d_caseD_6f;
        uVar4 = parse_hex4(pbVar15 + 2);
        if ((uVar4 & 0xfffffc00) == 0xd800) {
          if (((5 < (long)pbVar11 - (long)(pbVar15 + 6)) && (pbVar15[6] == 0x5c)) &&
             ((pbVar15[7] == 0x75 && (uVar5 = parse_hex4(pbVar15 + 8), 0xfffffbff < uVar5 - 0xe000))
             )) {
            uVar4 = (uVar4 & 0x3ff) * 0x400 + (uVar5 & 0x3ff) + 0x10000;
            bVar8 = 0xf0;
            lVar10 = 0xc;
            lStack_40 = 4;
LAB_00104112:
            bVar3 = true;
            lVar12 = lStack_40;
            goto LAB_0010411f;
          }
          goto switchD_0010401d_caseD_6f;
        }
        if ((uVar4 & 0xfffffc00) == 0xdc00) goto switchD_0010401d_caseD_6f;
        if (uVar4 < 0x80) {
          bVar3 = false;
          lVar10 = 6;
          lVar12 = 1;
          bVar8 = 0;
        }
        else {
          bVar8 = 0xc0;
          bVar3 = true;
          if (uVar4 < 0x800) {
            lVar10 = 6;
            lVar12 = 2;
          }
          else {
            bVar8 = 0xe0;
            if (uVar4 < 0x10000) {
              lStack_40 = 6;
              lVar10 = lStack_40;
              lStack_40 = 3;
              goto LAB_00104112;
            }
            bVar8 = 0xf0;
            lStack_40 = 6;
            lVar12 = 4;
            lVar10 = lStack_40;
            if (0x10ffff < uVar4) goto switchD_0010401d_caseD_6f;
          }
        }
LAB_0010411f:
        uVar13 = (ulong)uVar4;
        lVar14 = lVar12;
        while( true ) {
          lVar14 = lVar14 + -1;
          bVar2 = (byte)uVar13;
          if (lVar14 == 0) break;
          pbVar16[lVar14] = bVar2 & 0x3f | 0x80;
          uVar13 = uVar13 >> 6;
        }
        bVar9 = bVar2 & 0x7f;
        if (bVar3) {
          bVar9 = bVar2 | bVar8;
        }
        *pbVar16 = bVar9;
        pbVar16 = pbVar16 + lVar12;
        goto LAB_0010409d;
      default:
        if (((bVar8 == 0x22) || (bVar8 == 0x2f)) || (bVar8 == 0x5c)) {
          *pbVar16 = bVar8;
        }
        else if (bVar8 == 0x66) {
          *pbVar16 = 0xc;
        }
        else {
          if (bVar8 != 0x62) goto switchD_0010401d_caseD_6f;
          *pbVar16 = 8;
        }
      }
      pbVar16 = pbVar16 + 1;
LAB_0010409d:
      pbVar15 = pbVar15 + lVar10;
    }
    else {
      pbVar15 = pbVar15 + 1;
      *pbVar16 = bVar8;
      pbVar16 = pbVar16 + 1;
    }
    goto LAB_00103fb2;
  }
  *pbVar16 = 0;
  item->type = 0x10;
  item->valuestring = (char *)pbVar7;
  pbVar15 = pbVar11 + (1 - (long)input_buffer->content);
  cVar6 = 1;
LAB_001041a0:
  input_buffer->offset = (size_t)pbVar15;
  return cVar6;
}

Assistant:

static cJSON_bool parse_string(cJSON * const item, parse_buffer * const input_buffer)
{
    const unsigned char *input_pointer = buffer_at_offset(input_buffer) + 1;
    const unsigned char *input_end = buffer_at_offset(input_buffer) + 1;
    unsigned char *output_pointer = NULL;
    unsigned char *output = NULL;

    /* not a string */
    if (buffer_at_offset(input_buffer)[0] != '\"')
    {
        goto fail;
    }

    {
        /* calculate approximate size of the output (overestimate) */
        size_t allocation_length = 0;
        size_t skipped_bytes = 0;
        while (((size_t)(input_end - input_buffer->content) < input_buffer->length) && (*input_end != '\"'))
        {
            /* is escape sequence */
            if (input_end[0] == '\\')
            {
                if ((size_t)(input_end + 1 - input_buffer->content) >= input_buffer->length)
                {
                    /* prevent buffer overflow when last input character is a backslash */
                    goto fail;
                }
                skipped_bytes++;
                input_end++;
            }
            input_end++;
        }
        if (((size_t)(input_end - input_buffer->content) >= input_buffer->length) || (*input_end != '\"'))
        {
            goto fail; /* string ended unexpectedly */
        }

        /* This is at most how much we need for the output */
        allocation_length = (size_t) (input_end - buffer_at_offset(input_buffer)) - skipped_bytes;
        output = (unsigned char*)input_buffer->hooks.allocate(allocation_length + sizeof(""));
        if (output == NULL)
        {
            goto fail; /* allocation failure */
        }
    }

    output_pointer = output;
    /* loop through the string literal */
    while (input_pointer < input_end)
    {
        if (*input_pointer != '\\')
        {
            *output_pointer++ = *input_pointer++;
        }
        /* escape sequence */
        else
        {
            unsigned char sequence_length = 2;
            if ((input_end - input_pointer) < 1)
            {
                goto fail;
            }

            switch (input_pointer[1])
            {
                case 'b':
                    *output_pointer++ = '\b';
                    break;
                case 'f':
                    *output_pointer++ = '\f';
                    break;
                case 'n':
                    *output_pointer++ = '\n';
                    break;
                case 'r':
                    *output_pointer++ = '\r';
                    break;
                case 't':
                    *output_pointer++ = '\t';
                    break;
                case '\"':
                case '\\':
                case '/':
                    *output_pointer++ = input_pointer[1];
                    break;

                /* UTF-16 literal */
                case 'u':
                    sequence_length = utf16_literal_to_utf8(input_pointer, input_end, &output_pointer);
                    if (sequence_length == 0)
                    {
                        /* failed to convert UTF16-literal to UTF-8 */
                        goto fail;
                    }
                    break;

                default:
                    goto fail;
            }
            input_pointer += sequence_length;
        }
    }

    /* zero terminate the output */
    *output_pointer = '\0';

    item->type = cJSON_String;
    item->valuestring = (char*)output;

    input_buffer->offset = (size_t) (input_end - input_buffer->content);
    input_buffer->offset++;

    return true;

fail:
    if (output != NULL)
    {
        input_buffer->hooks.deallocate(output);
    }

    if (input_pointer != NULL)
    {
        input_buffer->offset = (size_t)(input_pointer - input_buffer->content);
    }

    return false;
}